

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

QSize __thiscall QtMWidgets::PickerPrivate::sizeHint(PickerPrivate *this,QStyleOption *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QStyleOption *pQVar4;
  int widgetHeight;
  int widgetWidth;
  QLatin1String local_58;
  QString local_48;
  QRect local_30;
  QStyleOption *local_20;
  QStyleOption *opt_local;
  PickerPrivate *this_local;
  
  local_20 = opt;
  opt_local = (QStyleOption *)this;
  computeStringWidth(this);
  pQVar4 = local_20 + 0x20;
  QLatin1String::QLatin1String(&local_58,"A");
  QString::QString(&local_48,local_58);
  local_30 = (QRect)QFontMetrics::boundingRect((QString *)pQVar4);
  iVar2 = QRect::height(&local_30);
  this->stringHeight = iVar2;
  QString::~QString(&local_48);
  this->itemTopMargin = this->stringHeight / 3;
  iVar2 = QFontMetrics::averageCharWidth();
  this->itemSideMargin = iVar2 * 3;
  iVar2 = this->maxStringWidth;
  iVar1 = this->itemSideMargin;
  iVar3 = QFontMetrics::averageCharWidth();
  QSize::QSize((QSize *)&this_local,iVar2 + iVar1 * 2 + iVar3 * 2,
               (this->stringHeight + this->itemTopMargin) * this->itemsCount - this->itemTopMargin);
  return (QSize)this_local;
}

Assistant:

QSize
PickerPrivate::sizeHint( const QStyleOption & opt )
{
	computeStringWidth();

	stringHeight = opt.fontMetrics.boundingRect( QLatin1String( "A" ) ).height();

	itemTopMargin = stringHeight / 3;

	itemSideMargin = opt.fontMetrics.averageCharWidth() * 3;

	const int widgetWidth = maxStringWidth + 2 * itemSideMargin +
		2 * opt.fontMetrics.averageCharWidth();
	const int widgetHeight = ( stringHeight + itemTopMargin ) *
		itemsCount - itemTopMargin;

	return QSize( widgetWidth, widgetHeight );
}